

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.cpp
# Opt level: O2

void __thiscall Menu::Menu(Menu *this,string *fileName)

{
  istream *piVar1;
  allocator local_251;
  string input;
  ifstream inputFile;
  byte abStack_210 [488];
  
  (this->options)._M_dataplus._M_p = (pointer)&(this->options).field_2;
  (this->options)._M_string_length = 0;
  (this->options).field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&inputFile);
  std::ifstream::open((string *)&inputFile,(_Ios_Openmode)fileName);
  std::__cxx11::string::string((string *)&input,"",&local_251);
  if ((abStack_210[*(long *)(_inputFile + -0x18)] & 5) == 0) {
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&inputFile,(string *)&input,'\n');
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::string::append((string *)this);
      std::__cxx11::string::append((char *)this);
    }
    std::ifstream::close();
  }
  else {
    std::__cxx11::string::assign((char *)this);
  }
  std::__cxx11::string::~string((string *)&input);
  std::ifstream::~ifstream(&inputFile);
  return;
}

Assistant:

Menu::Menu(std::string fileName) {
    // Open the file for reading
    std::ifstream inputFile;

    inputFile.open(fileName);

    std::string input = "";

    // Read each line of the file into the menu option string

    if(inputFile){
        while( std::getline(inputFile, input, '\n') ){
            options.append(input);
            options.append("\n");
        }
        inputFile.close();
    }
    else {
        options = "Nothing was loaded.";
    }
}